

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  node *pnVar1;
  int iVar2;
  long lVar3;
  nodecontext Context;
  node *p [10000];
  nodecontext nStack_13988;
  undefined8 auStack_13898 [10000];
  
  lVar3 = 0;
  NodeContext_Init(&nStack_13988,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0);
  do {
    pnVar1 = NodeCreate(&nStack_13988,0x45444f4e);
    auStack_13898[lVar3] = pnVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10000);
  iVar2 = 1000000;
  do {
    pnVar1 = NodeCreate(&nStack_13988,0x45444f4e);
    NodeDelete(pnVar1);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  lVar3 = 0;
  do {
    NodeDelete((node *)auStack_13898[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10000);
  NodeContext_Done(&nStack_13988);
  return 0;
}

Assistant:

int main(int UNUSED_PARAM(argc),char** UNUSED_PARAM(argv))
{
    node* p[10000];
    int i;
    nodecontext Context;
    NodeContext_Init(&Context,NULL,NULL,NULL);

    for (i=0;i<10000;++i)
        p[i] = NodeCreate(&Context,NODE_CLASS);

    for (i=0;i<1000000;++i)
        NodeDelete(NodeCreate(&Context,NODE_CLASS));

    for (i=0;i<10000;++i)
        NodeDelete(p[i]);

    NodeContext_Done(&Context);
    return 0;
}